

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.h
# Opt level: O2

void __thiscall fmp4_stream::trun::trun(trun *this)

{
  full_box::full_box(&this->super_full_box);
  (this->super_full_box).super_box._vptr_box = (_func_int **)&PTR_size_00121520;
  (this->m_sentry).
  super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_sentry).
  super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_sentry).
  super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->super_full_box).field_0x6c = 0;
  this->first_sample_flags_ = 0;
  this->data_offset_present_ = false;
  this->first_sample_flags_present_ = false;
  this->sample_duration_present_ = false;
  this->sample_size_present_ = false;
  this->sample_flags_present_ = false;
  this->sample_composition_time_offsets_present_ = false;
  std::__cxx11::string::assign((char *)&(this->super_full_box).super_box.box_type_);
  return;
}

Assistant:

trun() : full_box() 
		{
			zero_set();
			this->box_type_ = "trun"; 
		}